

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenModuleSetTypeName(BinaryenModuleRef module,BinaryenHeapType heapType,char *name)

{
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this;
  mapped_type *this_00;
  HeapType local_38;
  Name local_30;
  char *local_20;
  char *name_local;
  BinaryenHeapType heapType_local;
  BinaryenModuleRef module_local;
  
  local_20 = name;
  name_local = (char *)heapType;
  heapType_local = (BinaryenHeapType)module;
  wasm::Name::Name(&local_30,name);
  this = (unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
          *)(heapType_local + 0x120);
  wasm::HeapType::HeapType(&local_38,(TypeID)name_local);
  this_00 = std::
            unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
            ::operator[](this,&local_38);
  wasm::Name::operator=(&this_00->name,&local_30);
  return;
}

Assistant:

void BinaryenModuleSetTypeName(BinaryenModuleRef module,
                               BinaryenHeapType heapType,
                               const char* name) {
  ((Module*)module)->typeNames[HeapType(heapType)].name = name;
}